

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zone.h
# Opt level: O2

void __thiscall asmjit::RAPass::cleanup(RAPass *this,EVP_PKEY_CTX *ctx)

{
  void *pvVar1;
  size_t sVar2;
  long lVar3;
  size_t i;
  size_t sVar4;
  
  pvVar1 = (this->_contextVd).super_ZoneVectorBase._data;
  sVar2 = (this->_contextVd).super_ZoneVectorBase._length;
  for (sVar4 = 0; sVar2 != sVar4; sVar4 = sVar4 + 1) {
    lVar3 = *(long *)((long)pvVar1 + sVar4 * 8);
    *(undefined4 *)(lVar3 + 0x18) = 0xffffffff;
    *(undefined1 *)(lVar3 + 0x25) = 0xff;
  }
  (this->_contextVd).super_ZoneVectorBase._capacity = 0;
  (this->_contextVd).super_ZoneVectorBase._data = (void *)0x0;
  (this->_contextVd).super_ZoneVectorBase._length = 0;
  return;
}

Assistant:

ASMJIT_INLINE T* getData() noexcept { return static_cast<T*>(_data); }